

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlAttrDumpOutput(xmlSaveCtxtPtr ctxt,xmlAttrPtr cur)

{
  xmlOutputBufferPtr out;
  int iVar1;
  xmlOutputBufferPtr buf;
  xmlAttrPtr cur_local;
  xmlSaveCtxtPtr ctxt_local;
  
  if ((cur != (xmlAttrPtr)0x0) && (out = ctxt->buf, out != (xmlOutputBufferPtr)0x0)) {
    if (ctxt->format == 2) {
      xmlOutputBufferWriteWSNonSig(ctxt,2);
    }
    else {
      xmlOutputBufferWrite(out,1," ");
    }
    if ((cur->ns != (xmlNs *)0x0) && (cur->ns->prefix != (xmlChar *)0x0)) {
      xmlOutputBufferWriteString(out,(char *)cur->ns->prefix);
      xmlOutputBufferWrite(out,1,":");
    }
    xmlOutputBufferWriteString(out,(char *)cur->name);
    xmlOutputBufferWrite(out,2,"=\"");
    if (((((ctxt->options & 0x10U) == 0) || (cur->ns != (xmlNs *)0x0)) ||
        ((cur->children != (_xmlNode *)0x0 &&
         ((cur->children->content != (xmlChar *)0x0 && (*cur->children->content != '\0')))))) ||
       (iVar1 = htmlIsBooleanAttr(cur->name), iVar1 == 0)) {
      xmlSaveWriteAttrContent(ctxt,cur);
    }
    else {
      xmlOutputBufferWriteString(out,(char *)cur->name);
    }
    xmlOutputBufferWrite(out,1,"\"");
  }
  return;
}

Assistant:

static void
xmlAttrDumpOutput(xmlSaveCtxtPtr ctxt, xmlAttrPtr cur) {
    xmlOutputBufferPtr buf;

    if (cur == NULL) return;
    buf = ctxt->buf;
    if (buf == NULL) return;
    if (ctxt->format == 2)
        xmlOutputBufferWriteWSNonSig(ctxt, 2);
    else
        xmlOutputBufferWrite(buf, 1, " ");
    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
        xmlOutputBufferWriteString(buf, (const char *)cur->ns->prefix);
	xmlOutputBufferWrite(buf, 1, ":");
    }
    xmlOutputBufferWriteString(buf, (const char *)cur->name);
    xmlOutputBufferWrite(buf, 2, "=\"");
#ifdef LIBXML_HTML_ENABLED
    if ((ctxt->options & XML_SAVE_XHTML) &&
        (cur->ns == NULL) &&
        ((cur->children == NULL) ||
         (cur->children->content == NULL) ||
         (cur->children->content[0] == 0)) &&
        (htmlIsBooleanAttr(cur->name))) {
        xmlOutputBufferWriteString(buf, (const char *) cur->name);
    } else
#endif
    {
        xmlSaveWriteAttrContent(ctxt, cur);
    }
    xmlOutputBufferWrite(buf, 1, "\"");
}